

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *this,size_t bucket_cnt,hasher *hashfn,key_equal *eq,allocator_type *alloc)

{
  long lVar1;
  ulong new_capacity;
  
  this->ctrl_ = EmptyGroup<std::is_same<std::allocator<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>>()
                ::empty_group;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  this->slots_ = (slot_type *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  if (bucket_cnt != 0) {
    lVar1 = 0x3f;
    if (bucket_cnt != 0) {
      for (; bucket_cnt >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    new_capacity = 0xffffffffffffffff >> (~(byte)lVar1 & 0x3f);
    reset_growth_left(this,new_capacity);
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
  }
  return;
}

Assistant:

explicit raw_hash_set(size_t bucket_cnt, const hasher& hashfn = hasher(),
                          const key_equal& eq = key_equal(),
                          const allocator_type& alloc = allocator_type())
        : ctrl_(EmptyGroup<std_alloc_t>()), settings_(0, hashfn, eq, alloc) {
        if (bucket_cnt) {
            size_t new_capacity = NormalizeCapacity(bucket_cnt);
            reset_growth_left(new_capacity);
            initialize_slots(new_capacity);
            capacity_ = new_capacity;
        }
    }